

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

int64_t npas4::GetRAMSystemAvailable(void)

{
  int64_t iVar1;
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  iVar1 = GetRAMSystemUsed();
  return (ulong)sStack_78.mem_unit *
         (sStack_78.totalswap + sStack_78.totalram + sStack_78.totalhigh) - iVar1;
}

Assistant:

int64_t npas4::GetRAMSystemAvailable()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullAvailPhys) + static_cast<int64_t>(memInfo.ullAvailVirtual);
#else
	return npas4::GetRAMSystemTotal() - npas4::GetRAMSystemUsed();
#endif
}